

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall
cmCTestTestHandler::WriteTestResultFooter
          (cmCTestTestHandler *this,cmXMLWriter *xml,cmCTestTestResult *result)

{
  pointer pbVar1;
  string *label;
  pointer value;
  allocator<char> local_51;
  string local_50;
  
  if ((result->Properties->Labels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (result->Properties->Labels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Labels",&local_51);
    cmXMLWriter::StartElement(xml,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pbVar1 = (result->Properties->Labels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (value = (result->Properties->Labels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; value != pbVar1; value = value + 1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Label",&local_51);
      cmXMLWriter::Element<std::__cxx11::string>(xml,&local_50,value);
      std::__cxx11::string::~string((string *)&local_50);
    }
    cmXMLWriter::EndElement(xml);
  }
  cmXMLWriter::EndElement(xml);
  return;
}

Assistant:

void cmCTestTestHandler::WriteTestResultFooter(cmXMLWriter& xml,
                                               cmCTestTestResult const& result)
{
  if (!result.Properties->Labels.empty()) {
    xml.StartElement("Labels");
    std::vector<std::string> const& labels = result.Properties->Labels;
    for (std::string const& label : labels) {
      xml.Element("Label", label);
    }
    xml.EndElement(); // Labels
  }

  xml.EndElement(); // Test
}